

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

handle pybind11::detail::optional_caster<std::optional<kratos::EventControl>>::
       cast<std::optional<kratos::EventControl>const&>
                 (optional<kratos::EventControl> *src,return_value_policy policy,handle parent)

{
  handle hVar1;
  object local_18;
  
  if ((src->super__Optional_base<kratos::EventControl,_true,_true>)._M_payload.
      super__Optional_payload_base<kratos::EventControl>._M_engaged != false) {
    hVar1 = type_caster_base<kratos::EventControl>::cast((itype *)src,policy,parent);
    return (handle)hVar1.m_ptr;
  }
  local_18.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 2;
  object::~object(&local_18);
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

static handle cast(T_ &&src, return_value_policy policy, handle parent) {
        if (!src)
            return none().inc_ref();
        if (!std::is_lvalue_reference<T>::value) {
            policy = return_value_policy_override<T>::policy(policy);
        }
        return value_conv::cast(*std::forward<T_>(src), policy, parent);
    }